

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O3

void __thiscall
cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView
          (CompressedSnapshotRecordView *this,uchar *buf,size_t *inc)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t local_30;
  
  this->m_buffer = buf;
  uVar6 = (ulong)*buf;
  this->m_num_nodes = uVar6;
  sVar3 = 1;
  if (uVar6 != 0) {
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        if (-1 < (char)buf[lVar5 + sVar3]) goto LAB_00186b2e;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 9);
      lVar5 = 9;
LAB_00186b2e:
      sVar3 = sVar3 + lVar5 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar6);
  }
  this->m_imm_len = 0;
  this->m_imm_pos = sVar3;
  local_30 = sVar3 + 1;
  bVar2 = buf[sVar3];
  this->m_num_imm = (ulong)bVar2;
  if ((ulong)bVar2 != 0) {
    uVar6 = 0;
    do {
      lVar5 = 0;
      do {
        if (-1 < (char)buf[lVar5 + local_30]) goto LAB_00186b86;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 9);
      lVar5 = 9;
LAB_00186b86:
      lVar1 = local_30 + lVar5;
      local_30 = local_30 + lVar5 + 1;
      cali_variant_unpack(buf + lVar1 + 1,&local_30,(_Bool *)0x0);
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->m_num_imm);
    sVar3 = this->m_imm_pos;
  }
  this->m_imm_len = local_30 - sVar3;
  *inc = *inc + local_30;
  return;
}

Assistant:

CompressedSnapshotRecordView::CompressedSnapshotRecordView(const unsigned char* buf, size_t* inc) : m_buffer(buf)
{
    size_t pos = 0;

    m_num_nodes = buf[pos++];

    for (size_t i = 0; i < m_num_nodes; ++i)
        vldec_u64(buf + pos, &pos);

    m_imm_len = 0;
    m_imm_pos = pos;
    m_num_imm = buf[pos++];

    for (size_t i = 0; i < m_num_imm; ++i) {
        vldec_u64(buf + pos, &pos);
        Variant::unpack(buf + pos, &pos, nullptr);
    }

    m_imm_len = pos - m_imm_pos;
    *inc += pos;
}